

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  bool bVar1;
  LogMessage *other;
  string *psVar2;
  MethodOptions *this_00;
  MethodOptions *from_00;
  UnknownFieldSet *this_01;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  MethodDescriptorProto *local_18;
  MethodDescriptorProto *from_local;
  MethodDescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x10be);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      psVar2 = name_abi_cxx11_(local_18);
      set_name(this,psVar2);
    }
    bVar1 = has_input_type(local_18);
    if (bVar1) {
      psVar2 = input_type_abi_cxx11_(local_18);
      set_input_type(this,psVar2);
    }
    bVar1 = has_output_type(local_18);
    if (bVar1) {
      psVar2 = output_type_abi_cxx11_(local_18);
      set_output_type(this,psVar2);
    }
    bVar1 = has_options(local_18);
    if (bVar1) {
      this_00 = mutable_options(this);
      from_00 = options(local_18);
      MethodOptions::MergeFrom(this_00,from_00);
    }
  }
  this_01 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_01,other_00);
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_input_type()) {
      set_input_type(from.input_type());
    }
    if (from.has_output_type()) {
      set_output_type(from.output_type());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MethodOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}